

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O2

int MAFSA_automaton_str_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = 0xffffffffffffffff;
  do {
    uVar2 = sz_l;
    if (uVar3 - sz_l == -1) break;
    uVar2 = uVar3 + 1;
    lVar1 = uVar3 + 1;
    uVar3 = uVar2;
  } while (l[lVar1] != delim);
  MAFSA_automaton_val_to_int(l + uVar2 + 1,~uVar2 + sz_l,delim,out);
  return 0;
}

Assistant:

extern int MAFSA_automaton_str_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;

    for (i = 0; i < sz_l; ++i)
    {
        if (delim == l[i])
        {
            break;
        }
    }

    return MAFSA_automaton_val_to_int(l + i + 1,
        sz_l - i - 1, delim, out);
}